

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O0

void __thiscall btMatrixX<float>::copyLowerToUpperTriangle(btMatrixX<float> *this)

{
  int iVar1;
  btMatrixX<float> *in_RDI;
  int col;
  int row;
  int count;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 local_14;
  undefined4 local_10;
  
  local_10 = 0;
  while( true ) {
    iVar1 = rows(in_RDI);
    if (iVar1 <= local_10) break;
    for (local_14 = 0; local_14 < local_10; local_14 = local_14 + 1) {
      iVar1 = local_14;
      operator()((btMatrixX<float> *)CONCAT44(local_14,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      setElem((btMatrixX<float> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0.0);
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void copyLowerToUpperTriangle()
	{
		int count=0;
		for (int row=0;row<rows();row++)
		{
			for (int col=0;col<row;col++)
			{
				setElem(col,row, (*this)(row,col));
				count++;
				
			}
		}
		//printf("copyLowerToUpperTriangle copied %d elements out of %dx%d=%d\n", count,rows(),cols(),cols()*rows());
	}